

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::ArithMetaMethod(SQVM *this,SQInteger op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *dest)

{
  SQTable *pSVar1;
  int iVar2;
  SQChar *pSVar3;
  SQChar *pSVar4;
  SQMetaMethod mm;
  byte unaff_R13B;
  SQObjectPtr closure;
  
  if ((10 < op - 0x25U) || ((0x561U >> ((uint)(op - 0x25U) & 0x1f) & 1) == 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqvm.cpp"
                  ,0xa3,
                  "bool SQVM::ArithMetaMethod(SQInteger, const SQObjectPtr &, const SQObjectPtr &, SQObjectPtr &)"
                 );
  }
  if ((((o1->super_SQObject)._type & 0x2000000) != 0) &&
     (pSVar1 = (o1->super_SQObject)._unVal.pTable,
     (pSVar1->super_SQDelegable)._delegate != (SQTable *)0x0)) {
    closure.super_SQObject._type = OT_NULL;
    closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
    iVar2 = (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [6])(pSVar1,this,(ulong)(&UINT_001310dc)[op]);
    if ((char)iVar2 != '\0') {
      Push(this,o1);
      Push(this,o2);
      unaff_R13B = CallMetaMethod(this,&closure,mm,2,dest);
    }
    SQObjectPtr::~SQObjectPtr(&closure);
    if ((char)iVar2 != '\0') goto LAB_00128db9;
  }
  pSVar3 = GetTypeName(o1);
  pSVar4 = GetTypeName(o2);
  unaff_R13B = 0;
  Raise_Error(this,"arith op %c on between \'%s\' and \'%s\'",op,pSVar3,pSVar4);
LAB_00128db9:
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool SQVM::ArithMetaMethod(SQInteger op,const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &dest)
{
    SQMetaMethod mm;
    switch(op){
        case _SC('+'): mm=MT_ADD; break;
        case _SC('-'): mm=MT_SUB; break;
        case _SC('/'): mm=MT_DIV; break;
        case _SC('*'): mm=MT_MUL; break;
        case _SC('%'): mm=MT_MODULO; break;
        default: mm = MT_ADD; assert(0); break; //shutup compiler
    }
    if(is_delegable(o1) && _delegable(o1)->_delegate) {

        SQObjectPtr closure;
        if(_delegable(o1)->GetMetaMethod(this, mm, closure)) {
            Push(o1);Push(o2);
            return CallMetaMethod(closure,mm,2,dest);
        }
    }
    Raise_Error(_SC("arith op %c on between '%s' and '%s'"),op,GetTypeName(o1),GetTypeName(o2));
    return false;
}